

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O1

void ff_init_float128(flexfloat_t *obj,__float128 value,flexfloat_desc_t desc)

{
  fp_t fVar1;
  
  fVar1 = (fp_t)__trunctfdf2();
  obj->value = fVar1;
  obj->desc = desc;
  flexfloat_sanitize(obj);
  return;
}

Assistant:

INLINE void ff_init_float128(flexfloat_t *obj, __float128 value, flexfloat_desc_t desc) {
    obj->value = (fp_t)value;
    #ifdef FLEXFLOAT_TRACKING
    obj->exact_value = (fp_t)value;;
    obj->tracking_fn = 0;
    obj->tracking_arg = 0;
    #endif
    obj->desc = desc;
    flexfloat_sanitize(obj);
}